

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lfunc.c
# Opt level: O0

char * luaF_getlocalname(Proto *f,int param_2,int pc)

{
  bool bVar1;
  int local_24;
  int i;
  int pc_local;
  int local_number_local;
  Proto *f_local;
  
  local_24 = 0;
  i = param_2;
  while( true ) {
    bVar1 = false;
    if (local_24 < f->sizelocvars) {
      bVar1 = f->locvars[local_24].startpc <= pc;
    }
    if (!bVar1) break;
    if ((pc < f->locvars[local_24].endpc) && (i = i + -1, i == 0)) {
      return (char *)(f->locvars[local_24].varname + 1);
    }
    local_24 = local_24 + 1;
  }
  return (char *)0x0;
}

Assistant:

const char *luaF_getlocalname (const Proto *f, int local_number, int pc) {
  int i;
  for (i = 0; i<f->sizelocvars && f->locvars[i].startpc <= pc; i++) {
    if (pc < f->locvars[i].endpc) {  /* is variable active? */
      local_number--;
      if (local_number == 0)
        return getstr(f->locvars[i].varname);
    }
  }
  return NULL;  /* not found */
}